

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_CheckTfi(Fraig_Man_t *pMan,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  Fraig_Node_t *pNew_local;
  Fraig_Node_t *pOld_local;
  Fraig_Man_t *pMan_local;
  
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigUtil.c"
                  ,0xaf,"int Fraig_CheckTfi(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)");
  }
  if (((ulong)pNew & 1) == 0) {
    pMan->nTravIds = pMan->nTravIds + 1;
    iVar1 = Fraig_CheckTfi_rec(pMan,pNew,pOld);
    return iVar1;
  }
  __assert_fail("!Fraig_IsComplement(pNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigUtil.c"
                ,0xb0,"int Fraig_CheckTfi(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)");
}

Assistant:

int Fraig_CheckTfi( Fraig_Man_t * pMan, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    assert( !Fraig_IsComplement(pOld) );
    assert( !Fraig_IsComplement(pNew) );
    pMan->nTravIds++;
    return Fraig_CheckTfi_rec( pMan, pNew, pOld );
}